

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_f3ff::PrintWord(uint8_t *v,size_t size,ostream *out)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *this;
  ulong local_28;
  size_t i;
  ostream *out_local;
  size_t size_local;
  uint8_t *v_local;
  
  for (local_28 = 0; local_28 < size; local_28 = local_28 + 1) {
    if (local_28 != 0) {
      std::operator<<(out," ");
    }
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(out,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    this = (void *)std::ostream::operator<<(poVar3,std::hex);
    std::ostream::operator<<(this,(uint)v[local_28]);
  }
  return;
}

Assistant:

void PrintWord(const uint8_t *v, size_t size, std::ostream &out) {
  size_t i;
  for (i = 0; i < size; i++) {
    if (i > 0)
      out << " ";
    out << std::setfill('0')
        << std::setw(2)
        << std::hex
        << (int)v[i];
  }
}